

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Opnd * __thiscall
Lowerer::GenerateArgOutForStackArgs(Lowerer *this,Instr *callInstr,Instr *stackArgsInstr)

{
  Func *func_00;
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  ValueType VVar4;
  undefined4 *puVar5;
  Opnd *pOVar6;
  RegOpnd *pRVar7;
  Instr *pIVar8;
  RegOpnd *pRVar9;
  LabelInstr *branchTarget;
  IntConstOpnd *pIVar10;
  BranchInstr *pBVar11;
  LabelInstr *pLVar12;
  Loop *pLVar13;
  LabelInstr *branchTarget_00;
  Instr *pIVar14;
  IndirOpnd *pIVar15;
  undefined1 local_150 [8];
  AutoReuseOpnd autoReuseldElemDstOpnd2;
  AutoReuseOpnd autoReuseldElemDstOpnd3;
  RegOpnd *localTemp;
  Instr *branchToBlock;
  LabelInstr *loadBlockLabel;
  uint current_reg_pass;
  BranchInstr *tailBranch;
  Instr *argout;
  Instr *ldElem;
  AutoReuseOpnd autoReuseldElemDstOpnd;
  RegOpnd *ldElemDstOpnd;
  IndirOpnd *nthArgument;
  Instr *subInstr;
  Instr *branchOutOfLoop;
  LabelInstr *endLoop;
  Loop *loop;
  LabelInstr *startLoop;
  Instr *branchDoneArgs;
  LabelInstr *doneArgs;
  Instr *saveLenInstr;
  Instr *ldLen;
  AutoReuseOpnd autoReuseLdLenDstOpnd;
  RegOpnd *ldLenDstOpnd;
  RegOpnd *stackArgs;
  Func *func;
  Instr *stackArgsInstr_local;
  Instr *callInstr_local;
  Lowerer *this_local;
  
  if (stackArgsInstr->m_opcode != ArgOut_A_FromStackArgs) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5586,"(stackArgsInstr->m_opcode == Js::OpCode::ArgOut_A_FromStackArgs)",
                       "stackArgsInstr->m_opcode == Js::OpCode::ArgOut_A_FromStackArgs");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (callInstr->m_opcode != CallIDynamic) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5587,"(callInstr->m_opcode == Js::OpCode::CallIDynamic)",
                       "callInstr->m_opcode == Js::OpCode::CallIDynamic");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pOVar6 = IR::Instr::GetSrc1(callInstr);
  pRVar7 = IR::Opnd::AsRegOpnd(pOVar6);
  LowererMD::GenerateFunctionObjectTest(&this->m_lowererMD,callInstr,pRVar7,false,(LabelInstr *)0x0)
  ;
  bVar3 = Func::IsInlinee(callInstr->m_func);
  if (bVar3) {
    this_local = (Lowerer *)GenerateArgOutForInlineeStackArgs(this,callInstr,stackArgsInstr);
  }
  else {
    func_00 = callInstr->m_func;
    pOVar6 = IR::Instr::GetSrc1(stackArgsInstr);
    pRVar7 = IR::Opnd::AsRegOpnd(pOVar6);
    autoReuseLdLenDstOpnd._16_8_ = IR::RegOpnd::New(TyInt64,func_00);
    IR::AutoReuseOpnd::AutoReuseOpnd
              ((AutoReuseOpnd *)&ldLen,(Opnd *)autoReuseLdLenDstOpnd._16_8_,func_00,true);
    pIVar8 = IR::Instr::New(LdLen_A,(Opnd *)autoReuseLdLenDstOpnd._16_8_,&pRVar7->super_Opnd,func_00
                           );
    uVar2 = autoReuseLdLenDstOpnd._16_8_;
    VVar4 = ValueType::GetTaggedInt();
    IR::Opnd::SetValueType((Opnd *)uVar2,VVar4);
    IR::Instr::InsertBefore(callInstr,pIVar8);
    GenerateFastRealStackArgumentsLdLen(this,pIVar8);
    pRVar9 = IR::RegOpnd::New(TyInt64,func_00);
    pIVar8 = IR::Instr::New(MOV,&pRVar9->super_Opnd,(Opnd *)autoReuseLdLenDstOpnd._16_8_,func_00);
    pOVar6 = IR::Instr::GetDst(pIVar8);
    VVar4 = ValueType::GetTaggedInt();
    IR::Opnd::SetValueType(pOVar6,VVar4);
    IR::Instr::InsertBefore(callInstr,pIVar8);
    branchTarget = IR::LabelInstr::New(Label,func_00,false);
    uVar2 = autoReuseLdLenDstOpnd._16_8_;
    pIVar10 = IR::IntConstOpnd::New(0,TyInt8,func_00,false);
    pBVar11 = IR::BranchInstr::New(BrEq_I4,branchTarget,(Opnd *)uVar2,&pIVar10->super_Opnd,func_00);
    IR::Instr::InsertBefore(callInstr,&pBVar11->super_Instr);
    LowererMD::EmitInt4Instr(&pBVar11->super_Instr);
    pLVar12 = InsertLoopTopLabel(this,callInstr);
    pLVar13 = IR::LabelInstr::GetLoop(pLVar12);
    branchTarget_00 = IR::LabelInstr::New(Label,func_00,false);
    uVar2 = autoReuseLdLenDstOpnd._16_8_;
    pIVar10 = IR::IntConstOpnd::New(1,TyInt8,func_00,false);
    pBVar11 = IR::BranchInstr::New
                        (BrLe_I4,branchTarget_00,(Opnd *)uVar2,&pIVar10->super_Opnd,func_00);
    IR::Instr::InsertBefore(callInstr,&pBVar11->super_Instr);
    LowererMD::EmitInt4Instr(&pBVar11->super_Instr);
    uVar2 = autoReuseLdLenDstOpnd._16_8_;
    pIVar10 = IR::IntConstOpnd::New(1,TyInt64,func_00,false);
    pIVar14 = IR::Instr::New(Sub_I4,(Opnd *)uVar2,(Opnd *)uVar2,&pIVar10->super_Opnd,func_00);
    IR::Instr::InsertBefore(callInstr,pIVar14);
    LowererMD::EmitInt4Instr(pIVar14);
    pIVar15 = IR::IndirOpnd::New(pRVar7,(RegOpnd *)autoReuseLdLenDstOpnd._16_8_,TyInt64,func_00);
    autoReuseldElemDstOpnd._16_8_ = IR::RegOpnd::New(TyInt64,func_00);
    IR::AutoReuseOpnd::AutoReuseOpnd
              ((AutoReuseOpnd *)&ldElem,(Opnd *)autoReuseldElemDstOpnd._16_8_,func_00,true);
    pIVar14 = IR::Instr::New(LdElemI_A,(Opnd *)autoReuseldElemDstOpnd._16_8_,&pIVar15->super_Opnd,
                             func_00);
    IR::Instr::InsertBefore(callInstr,pIVar14);
    GenerateFastStackArgumentsLdElemI(this,pIVar14);
    pIVar14 = IR::Instr::New(ArgOut_A_Dynamic,func_00);
    IR::Instr::SetSrc1(pIVar14,(Opnd *)autoReuseldElemDstOpnd._16_8_);
    IR::Instr::SetSrc2(pIVar14,(Opnd *)autoReuseLdLenDstOpnd._16_8_);
    IR::Instr::InsertBefore(callInstr,pIVar14);
    LowererMD::LoadDynamicArgumentUsingLength(&this->m_lowererMD,pIVar14);
    pBVar11 = IR::BranchInstr::New(JMP,pLVar12,func_00);
    IR::Instr::InsertBefore(callInstr,&pBVar11->super_Instr);
    IR::Instr::InsertBefore(callInstr,&branchTarget_00->super_Instr);
    BVSparse<Memory::JitArenaAllocator>::Set
              ((pLVar13->regAlloc).liveOnBackEdgeSyms,
               *(BVIndex *)(*(long *)(autoReuseLdLenDstOpnd._16_8_ + 0x10) + 0x10));
    loadBlockLabel._4_4_ = 0;
    do {
      if (loadBlockLabel._4_4_ != 0) {
        pLVar12 = IR::LabelInstr::New(Label,func_00,false);
        uVar2 = autoReuseLdLenDstOpnd._16_8_;
        pIVar10 = IR::IntConstOpnd::New((ulong)(loadBlockLabel._4_4_ + 1),TyInt8,func_00,false);
        pBVar11 = IR::BranchInstr::New(BrEq_I4,pLVar12,(Opnd *)uVar2,&pIVar10->super_Opnd,func_00);
        IR::Instr::InsertAfter(&branchTarget_00->super_Instr,&pBVar11->super_Instr);
        IR::Instr::InsertBefore(callInstr,&pLVar12->super_Instr);
      }
      pRVar9 = IR::RegOpnd::New(TyInt32,func_00);
      VVar4 = ValueType::GetTaggedInt();
      IR::Opnd::SetValueType(&pRVar9->super_Opnd,VVar4);
      IR::AutoReuseOpnd::AutoReuseOpnd
                ((AutoReuseOpnd *)&autoReuseldElemDstOpnd2.autoDelete,&pRVar9->super_Opnd,func_00,
                 true);
      pIVar10 = IR::IntConstOpnd::New((ulong)loadBlockLabel._4_4_,TyInt8,func_00,true);
      InsertMove(&pRVar9->super_Opnd,&pIVar10->super_Opnd,callInstr,true);
      pIVar15 = IR::IndirOpnd::New(pRVar7,pRVar9,TyInt64,func_00);
      autoReuseldElemDstOpnd._16_8_ = IR::RegOpnd::New(TyInt64,func_00);
      IR::AutoReuseOpnd::AutoReuseOpnd
                ((AutoReuseOpnd *)local_150,(Opnd *)autoReuseldElemDstOpnd._16_8_,func_00,true);
      pIVar14 = IR::Instr::New(LdElemI_A,(Opnd *)autoReuseldElemDstOpnd._16_8_,&pIVar15->super_Opnd,
                               func_00);
      IR::Instr::InsertBefore(callInstr,pIVar14);
      GenerateFastStackArgumentsLdElemI(this,pIVar14);
      pIVar14 = IR::Instr::New(ArgOut_A_Dynamic,func_00);
      IR::Instr::SetSrc1(pIVar14,(Opnd *)autoReuseldElemDstOpnd._16_8_);
      IR::Instr::InsertBefore(callInstr,pIVar14);
      LowererMD::LoadDynamicArgument(&this->m_lowererMD,pIVar14,loadBlockLabel._4_4_ + 4);
      IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_150);
      IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseldElemDstOpnd2.autoDelete);
      bVar3 = loadBlockLabel._4_4_ != 0;
      loadBlockLabel._4_4_ = loadBlockLabel._4_4_ - 1;
    } while (bVar3);
    IR::Instr::InsertBefore(callInstr,&branchTarget->super_Instr);
    pOVar6 = IR::Instr::GetDst(pIVar8);
    this_local = (Lowerer *)IR::Opnd::AsRegOpnd(pOVar6);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&ldElem);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&ldLen);
  }
  return (Opnd *)this_local;
}

Assistant:

IR::Opnd*
Lowerer::GenerateArgOutForStackArgs(IR::Instr* callInstr, IR::Instr* stackArgsInstr)
{

// For architectures were we only pass 4 parameters in registers, the
// generated code looks something like this:
//    s25.var       =  LdLen_A          s4.var
//    s26.var       =  Ld_A             s25.var
//                    BrEq_I4          $L3, s25.var,0                    // If we have no further arguments to pass, don't pass them
//    $L2:
//                    BrEq_I4          $L4, s25.var,1                    // Loop through the rest of the arguments, putting them on the stack
//    s25.var       = SUB_I4            s25.var, 0x1
//    s10.var       = LdElemI_A         [s4.var+s25.var].var
//                    ArgOut_A_Dynamic  s10.var, s25.var
//                    Br $L2
//    $L4:
//    s25.var       = LdImm             0                                // set s25 to 0, since it'll be 1 on the way into this block
//    s10.var       = LdElemI_A         [s4.var + 0 * MachReg].var // The last one has to be put into argslot 4, since this is likely a register, not a stack location.
//                    ArgOut_A_Dynamic  s10.var, 4
//    $L3:
//
// Generalizing this for more register-passed parameters gives us code
// something like this:
//    s25.var       =  LdLen_A          s4.var
//    s26.var       =  Ld_A             s25.var
//                    BrLe_I4          $L3, s25.var,0                    // If we have no further arguments to pass, don't pass them
//    $L2:
//                    BrLe_I4          $L4, s25.var,INT_REG_COUNT-3      // Loop through the rest of the arguments up to the number passed in registers, putting them on the stack
//    s25.var       = SUB_I4            s25.var, 0x1
//    s10.var       = LdElemI_A         [s4.var+s25.var].var
//                    ArgOut_A_Dynamic  s10.var, s25.var
//                    Br $L2
//    $L4:
//    foreach of the remaining ones, N going down from (the number we can pass in regs -1) to 1 (0 omitted as we know that it'll be at least one register argument):
//                    BrEq_I4          $L__N, s25.var, N
//    end foreach
//    foreach of the remaining ones, N going down from (the number we can pass in regs -1) to 0:
//    $L__N:
//    s10.var       = LdElemI_A         [s4.var + N * MachReg].var // The last one has to be put into argslot 4, since this is likely a register, not a stack location.
//                    ArgOut_A_Dynamic  s10.var, N+3
//    end foreach
//    $L3:


#if defined(_M_IX86)
    // We get a compilation error on x86 due to assigning a negative to a uint
    // TODO: don't even define this function on x86 - we Assert(false) anyway there.
    // Alternatively, don't define when INT_ARG_REG_COUNT - 4 < 0
    AssertOrFailFast(false);
    return nullptr;
#else

    Assert(stackArgsInstr->m_opcode == Js::OpCode::ArgOut_A_FromStackArgs);
    Assert(callInstr->m_opcode == Js::OpCode::CallIDynamic);

    this->m_lowererMD.GenerateFunctionObjectTest(callInstr, callInstr->GetSrc1()->AsRegOpnd(), false);

    if (callInstr->m_func->IsInlinee())
    {
        return this->GenerateArgOutForInlineeStackArgs(callInstr, stackArgsInstr);
    }
    Func *func = callInstr->m_func;
    IR::RegOpnd* stackArgs = stackArgsInstr->GetSrc1()->AsRegOpnd();

    IR::RegOpnd* ldLenDstOpnd = IR::RegOpnd::New(TyMachReg, func);
    const IR::AutoReuseOpnd autoReuseLdLenDstOpnd(ldLenDstOpnd, func);
    IR::Instr* ldLen = IR::Instr::New(Js::OpCode::LdLen_A, ldLenDstOpnd ,stackArgs, func);
    ldLenDstOpnd->SetValueType(ValueType::GetTaggedInt()); /*LdLen_A works only on stack arguments*/
    callInstr->InsertBefore(ldLen);
    GenerateFastRealStackArgumentsLdLen(ldLen);

    IR::Instr* saveLenInstr = IR::Instr::New(Js::OpCode::MOV, IR::RegOpnd::New(TyMachReg, func), ldLenDstOpnd, func);
    saveLenInstr->GetDst()->SetValueType(ValueType::GetTaggedInt());
    callInstr->InsertBefore(saveLenInstr);

    IR::LabelInstr* doneArgs = IR::LabelInstr::New(Js::OpCode::Label, func);
    IR::Instr* branchDoneArgs = IR::BranchInstr::New(Js::OpCode::BrEq_I4, doneArgs, ldLenDstOpnd, IR::IntConstOpnd::New(0, TyInt8, func),func);
    callInstr->InsertBefore(branchDoneArgs);
    this->m_lowererMD.EmitInt4Instr(branchDoneArgs);

    IR::LabelInstr* startLoop = InsertLoopTopLabel(callInstr);
    Loop * loop = startLoop->GetLoop();
    IR::LabelInstr* endLoop = IR::LabelInstr::New(Js::OpCode::Label, func);

    IR::Instr* branchOutOfLoop = IR::BranchInstr::New(Js::OpCode::BrLe_I4, endLoop, ldLenDstOpnd, IR::IntConstOpnd::New(INT_ARG_REG_COUNT - 3, TyInt8, func),func);
    callInstr->InsertBefore(branchOutOfLoop);
    this->m_lowererMD.EmitInt4Instr(branchOutOfLoop);

    IR::Instr* subInstr = IR::Instr::New(Js::OpCode::Sub_I4, ldLenDstOpnd, ldLenDstOpnd, IR::IntConstOpnd::New(1, TyMachReg, func),func);
    callInstr->InsertBefore(subInstr);
    this->m_lowererMD.EmitInt4Instr(subInstr);

    IR::IndirOpnd *nthArgument = IR::IndirOpnd::New(stackArgs, ldLenDstOpnd, TyMachReg, func);
    IR::RegOpnd* ldElemDstOpnd = IR::RegOpnd::New(TyMachReg,func);
    const IR::AutoReuseOpnd autoReuseldElemDstOpnd(ldElemDstOpnd, func);
    IR::Instr* ldElem = IR::Instr::New(Js::OpCode::LdElemI_A, ldElemDstOpnd, nthArgument, func);
    callInstr->InsertBefore(ldElem);
    GenerateFastStackArgumentsLdElemI(ldElem);

    IR::Instr* argout = IR::Instr::New(Js::OpCode::ArgOut_A_Dynamic, func);
    argout->SetSrc1(ldElemDstOpnd);
    argout->SetSrc2(ldLenDstOpnd);
    callInstr->InsertBefore(argout);
    this->m_lowererMD.LoadDynamicArgumentUsingLength(argout);

    IR::BranchInstr *tailBranch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, startLoop, func);
    callInstr->InsertBefore(tailBranch);

    callInstr->InsertBefore(endLoop);

    loop->regAlloc.liveOnBackEdgeSyms->Set(ldLenDstOpnd->m_sym->m_id);

    // Note: This loop iteratively adds instructions in two locations; in the block
    // of branches that jump to the "load elements to argOuts" instructions, and in
    // the the block of load elements to argOuts instructions themselves.

    // 4 to denote this is 4th register after this, callinfo & function object
    // INT_ARG_REG_COUNT is the number of parameters passed in int regs
    uint current_reg_pass = INT_ARG_REG_COUNT - 4;

    do
    {
        // If we're on this pass we know we have to do at least one of these, so skip
        // the branch if we're on the last one.
        if (current_reg_pass != INT_ARG_REG_COUNT - 4)
        {
            IR::LabelInstr* loadBlockLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
            IR::Instr* branchToBlock = IR::BranchInstr::New(Js::OpCode::BrEq_I4, loadBlockLabel, ldLenDstOpnd, IR::IntConstOpnd::New(current_reg_pass + 1, TyInt8, func), func);
            endLoop->InsertAfter(branchToBlock);
            callInstr->InsertBefore(loadBlockLabel);
        }

        // TODO: We can further optimize this with a GenerateFastStackArgumentsLdElemI that can
        // handle us passing along constant argument references and encode them into the offset
        // instead of having to use an IndirOpnd; this would allow us to save a few bytes here,
        // and reduce register pressure a hair

        // stemp.var = LdImm current_reg_pass
        IR::RegOpnd* localTemp = IR::RegOpnd::New(TyInt32, func);
        // We need to make it a tagged int because GenerateFastStackArgumentsLdElemI asserts if
        // it is not.
        localTemp->SetValueType(ValueType::GetTaggedInt());
        const IR::AutoReuseOpnd autoReuseldElemDstOpnd3(localTemp, func);
        this->InsertMove(localTemp, IR::IntConstOpnd::New(current_reg_pass, TyInt8, func, true), callInstr);

        // sTemp = LdElem_I   [s4.var + current_reg_pass (aka stemp.var) ]
        nthArgument = IR::IndirOpnd::New(stackArgs, localTemp, TyMachReg, func);
        ldElemDstOpnd = IR::RegOpnd::New(TyMachReg, func);
        const IR::AutoReuseOpnd autoReuseldElemDstOpnd2(ldElemDstOpnd, func);
        ldElem = IR::Instr::New(Js::OpCode::LdElemI_A, ldElemDstOpnd, nthArgument, func);
        callInstr->InsertBefore(ldElem);
        GenerateFastStackArgumentsLdElemI(ldElem);

        argout = IR::Instr::New(Js::OpCode::ArgOut_A_Dynamic, func);
        argout->SetSrc1(ldElemDstOpnd);
        callInstr->InsertBefore(argout);
        this->m_lowererMD.LoadDynamicArgument(argout, current_reg_pass + 4);
    }
    while (current_reg_pass-- != 0);

    callInstr->InsertBefore(doneArgs);

    /*return the length which will be used for callInfo generations & stack allocation*/
    return saveLenInstr->GetDst()->AsRegOpnd();
#endif
}